

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O1

void swrenderer::rt_draw4cols(int sx)

{
  uint uVar1;
  int *piVar2;
  uint *puVar3;
  DFrameBuffer *pDVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  long *plVar10;
  uint uVar11;
  int drawcount;
  uint uVar12;
  int iVar13;
  
  pDVar4 = screen;
  lVar5 = 0;
  do {
    piVar2 = *(int **)((long)&drawerargs::dc_ctspan + lVar5);
    *piVar2 = (pDVar4->super_DSimpleCanvas).super_DCanvas.Height + 1;
    piVar2[1] = (pDVar4->super_DSimpleCanvas).super_DCanvas.Height;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x20);
  lVar5 = 0;
  uVar7 = 0xffffffff;
  uVar6 = 0;
  do {
    while( true ) {
      do {
        if ((&drawerargs::horizspan)[lVar5] < (ulong)(&drawerargs::dc_ctspan)[lVar5]) {
          uVar1 = *(uint *)((long)(&drawerargs::horizspan)[lVar5] + 8);
          if (uVar1 < uVar7) {
            uVar7 = uVar1;
          }
        }
        else {
          uVar6 = uVar6 | 1 << ((uint)lVar5 & 0x1f);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if (uVar6 == 0xf) {
        return;
      }
      uVar1 = *DAT_007658a8;
      if (*DAT_007658a8 < *drawerargs::horizspan) {
        uVar1 = *drawerargs::horizspan;
      }
      uVar12 = *DAT_007658b8;
      if (*DAT_007658b8 < *DAT_007658b0) {
        uVar12 = *DAT_007658b0;
      }
      if (uVar12 < uVar1) {
        uVar12 = uVar1;
      }
      uVar1 = DAT_007658a8[1];
      if (drawerargs::horizspan[1] < DAT_007658a8[1]) {
        uVar1 = drawerargs::horizspan[1];
      }
      uVar11 = DAT_007658b8[1];
      if (DAT_007658b0[1] < DAT_007658b8[1]) {
        uVar11 = DAT_007658b0[1];
      }
      if (uVar1 < uVar11) {
        uVar11 = uVar1;
      }
      if ((uVar6 != 0) || (uVar11 < uVar12)) break;
      puVar9 = &drawerargs::horizspan;
      uVar8 = 0;
      do {
        if (*(uint *)*puVar9 < uVar12) {
          (*hcolfunc_post1)(uVar8 & 0xffffffff,sx + (int)uVar8);
        }
        uVar8 = uVar8 + 1;
        puVar9 = puVar9 + 1;
      } while (uVar8 != 4);
      (*hcolfunc_post4)(sx,uVar12,uVar11);
      lVar5 = 0;
      do {
        piVar2 = *(int **)((long)&drawerargs::horizspan + lVar5);
        if (uVar11 < (uint)piVar2[1]) {
          *piVar2 = uVar11 + 1;
        }
        else {
          *(int **)((long)&drawerargs::horizspan + lVar5) = piVar2 + 2;
        }
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x20);
      lVar5 = 0;
      uVar7 = 0xffffffff;
      uVar6 = 0;
    }
    uVar8 = 0;
    plVar10 = (long *)&drawerargs::horizspan;
    iVar13 = 0;
    do {
      if ((uVar6 & 1) == 0) {
        puVar3 = (uint *)*plVar10;
        if (puVar3[1] < uVar7) {
          (*hcolfunc_post1)(uVar8 & 0xffffffff,sx + (int)uVar8,*puVar3);
          *plVar10 = *plVar10 + 8;
        }
        else {
          if (uVar7 <= *puVar3) goto LAB_002d1815;
          (*hcolfunc_post1)(uVar8 & 0xffffffff,sx + (int)uVar8,*puVar3,uVar7 - 1);
          *(uint *)*plVar10 = uVar7;
        }
        iVar13 = iVar13 + 1;
      }
LAB_002d1815:
      uVar6 = (int)uVar6 >> 1;
      uVar8 = uVar8 + 1;
      plVar10 = plVar10 + 1;
    } while (uVar8 != 4);
    lVar5 = 0;
    uVar7 = 0xffffffff;
    uVar6 = 0;
    if (iVar13 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void rt_draw4cols(int sx)
	{
		using namespace drawerargs;

		int x, bad;
		unsigned int maxtop, minbot, minnexttop;

		// Place a dummy "span" in each column. These don't get
		// drawn. They're just here to avoid special cases in the
		// max/min calculations below.
		for (x = 0; x < 4; ++x)
		{
			dc_ctspan[x][0] = screen->GetHeight()+1;
			dc_ctspan[x][1] = screen->GetHeight();
		}

		for (;;)
		{
			// If a column is out of spans, mark it as such
			bad = 0;
			minnexttop = 0xffffffff;
			for (x = 0; x < 4; ++x)
			{
				if (horizspan[x] >= dc_ctspan[x])
				{
					bad |= 1 << x;
				}
				else if ((horizspan[x]+2)[0] < minnexttop)
				{
					minnexttop = (horizspan[x]+2)[0];
				}
			}
			// Once all columns are out of spans, we're done
			if (bad == 15)
			{
				return;
			}

			// Find the largest shared area for the spans in each column
			maxtop = MAX (MAX (horizspan[0][0], horizspan[1][0]),
						  MAX (horizspan[2][0], horizspan[3][0]));
			minbot = MIN (MIN (horizspan[0][1], horizspan[1][1]),
						  MIN (horizspan[2][1], horizspan[3][1]));

			// If there is no shared area with these spans, draw each span
			// individually and advance to the next spans until we reach a shared area.
			// However, only draw spans down to the highest span in the next set of
			// spans. If we allow the entire height of a span to be drawn, it could
			// prevent any more shared areas from being drawn in these four columns.
			//
			// Example: Suppose we have the following arrangement:
			//			A CD
			//			A CD
			//			 B D
			//			 B D
			//			aB D
			//			aBcD
			//			aBcD
			//			aBc
			//
			// If we draw the entire height of the spans, we end up drawing this first:
			//			A CD
			//			A CD
			//			 B D
			//			 B D
			//			 B D
			//			 B D
			//			 B D
			//			 B D
			//			 B
			//
			// This leaves only the "a" and "c" columns to be drawn, and they are not
			// part of a shared area, but if we can include B and D with them, we can
			// get a shared area. So we cut off everything in the first set just
			// above the "a" column and end up drawing this first:
			//			A CD
			//			A CD
			//			 B D
			//			 B D
			//
			// Then the next time through, we have the following arrangement with an
			// easily shared area to draw:
			//			aB D
			//			aBcD
			//			aBcD
			//			aBc
			if (bad != 0 || maxtop > minbot)
			{
				int drawcount = 0;
				for (x = 0; x < 4; ++x)
				{
					if (!(bad & 1))
					{
						if (horizspan[x][1] < minnexttop)
						{
							hcolfunc_post1 (x, sx+x, horizspan[x][0], horizspan[x][1]);
							horizspan[x] += 2;
							drawcount++;
						}
						else if (minnexttop > horizspan[x][0])
						{
							hcolfunc_post1 (x, sx+x, horizspan[x][0], minnexttop-1);
							horizspan[x][0] = minnexttop;
							drawcount++;
						}
					}
					bad >>= 1;
				}
				// Drawcount *should* always be non-zero. The reality is that some situations
				// can make this not true. Unfortunately, I'm not sure what those situations are.
				if (drawcount == 0)
				{
					return;
				}
				continue;
			}

			// Draw any span fragments above the shared area.
			for (x = 0; x < 4; ++x)
			{
				if (maxtop > horizspan[x][0])
				{
					hcolfunc_post1 (x, sx+x, horizspan[x][0], maxtop-1);
				}
			}

			// Draw the shared area.
			hcolfunc_post4 (sx, maxtop, minbot);

			// For each column, if part of the span is past the shared area,
			// set its top to just below the shared area. Otherwise, advance
			// to the next span in that column.
			for (x = 0; x < 4; ++x)
			{
				if (minbot < horizspan[x][1])
				{
					horizspan[x][0] = minbot+1;
				}
				else
				{
					horizspan[x] += 2;
				}
			}
		}
	}